

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int send_certificate_and_certificate_verify
              (ptls_t *tls,ptls_message_emitter_t *emitter,
              st_ptls_signature_algorithms_t *signature_algorithms,ptls_iovec_t context,
              char *context_string,int push_status_request,uint16_t *compress_algos,
              size_t num_compress_algos)

{
  ptls_buffer_t *buf;
  ptls_key_schedule_t *ppVar1;
  uint8_t *puVar2;
  st_ptls_sign_certificate_t *psVar3;
  ptls_buffer_t *ppVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  ptls_hash_context_t **pppVar9;
  size_t sVar10;
  ptls_emit_certificate_t *ppVar11;
  size_t sVar12;
  bool bVar13;
  ptls_iovec_t pVar14;
  uint16_t algo;
  ptls_message_emitter_t *local_148;
  ptls_buffer_t *local_140;
  size_t local_138;
  size_t local_130;
  char *local_128;
  st_ptls_signature_algorithms_t *local_120;
  uint8_t data [226];
  
  if (signature_algorithms->count == 0) {
    return 0x6d;
  }
  ppVar11 = tls->ctx->emit_certificate;
  local_148 = emitter;
  local_128 = context_string;
  local_120 = signature_algorithms;
  if (ppVar11 == (ptls_emit_certificate_t *)0x0) {
    ppVar11 = &send_certificate_and_certificate_verify::default_emit_certificate;
  }
  while (iVar5 = (*ppVar11->cb)(ppVar11,tls,local_148,tls->key_schedule,context,push_status_request,
                                compress_algos,num_compress_algos), iVar5 == 0x20a) {
    bVar13 = ppVar11 == &send_certificate_and_certificate_verify::default_emit_certificate;
    ppVar11 = &send_certificate_and_certificate_verify::default_emit_certificate;
    if (bVar13) {
      __assert_fail("emit_certificate != &default_emit_certificate",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                    ,0xa7d,
                    "int send_certificate_and_certificate_verify(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, ptls_iovec_t, const char *, int, const uint16_t *, size_t)"
                   );
    }
  }
  if (iVar5 != 0) {
    return iVar5;
  }
  if (tls->ctx->sign_certificate == (ptls_sign_certificate_t *)0x0) {
    return 0;
  }
  iVar5 = (*local_148->begin_message)(local_148);
  if (iVar5 != 0) {
    return iVar5;
  }
  buf = local_148->buf;
  ppVar1 = tls->key_schedule;
  sVar6 = buf->off;
  iVar5 = ptls_buffer_reserve(buf,1);
  if (iVar5 == 0) {
    buf->base[buf->off] = '\x0f';
    buf->off = buf->off + 1;
    iVar5 = 0;
  }
  if (iVar5 == 0) {
    iVar5 = ptls_buffer_reserve(buf,3);
    if (iVar5 == 0) {
      puVar2 = buf->base;
      sVar12 = buf->off;
      puVar2[sVar12 + 2] = '\0';
      puVar2 = puVar2 + sVar12;
      puVar2[0] = '\0';
      puVar2[1] = '\0';
      buf->off = buf->off + 3;
      iVar5 = 0;
    }
    if (iVar5 == 0) {
      sVar12 = buf->off;
      local_140 = local_148->buf;
      local_130 = local_140->off;
      iVar5 = ptls_buffer_reserve(local_140,2);
      if (iVar5 == 0) {
        puVar2 = local_140->base;
        sVar10 = local_140->off;
        (puVar2 + sVar10)[0] = '\0';
        (puVar2 + sVar10)[1] = '\0';
        local_140->off = local_140->off + 2;
        iVar5 = 0;
      }
      bVar13 = iVar5 != 0;
      if (iVar5 == 0) {
        iVar5 = ptls_buffer_reserve(local_140,2);
        ppVar4 = local_140;
        if (iVar5 == 0) {
          puVar2 = local_140->base;
          sVar10 = local_140->off;
          (puVar2 + sVar10)[0] = '\0';
          (puVar2 + sVar10)[1] = '\0';
          local_140->off = local_140->off + 2;
          iVar5 = 0;
        }
        bVar13 = true;
        if (iVar5 == 0) {
          sVar10 = local_140->off;
          local_138 = sVar6;
          sVar6 = build_certificate_verify_signdata(data,tls->key_schedule,local_128);
          psVar3 = tls->ctx->sign_certificate;
          pVar14.len = sVar6;
          pVar14.base = data;
          iVar5 = (*psVar3->cb)(psVar3,tls,&algo,ppVar4,pVar14,local_120->list,local_120->count);
          bVar13 = true;
          sVar6 = local_138;
          if (iVar5 == 0) {
            ppVar4->base[local_130] = algo._1_1_;
            ppVar4->base[local_130 + 1] = (uint8_t)algo;
            uVar7 = ppVar4->off - sVar10;
            lVar8 = 8;
            do {
              ppVar4->base[sVar10 - 2] = (uint8_t)(uVar7 >> ((byte)lVar8 & 0x3f));
              lVar8 = lVar8 + -8;
              sVar10 = sVar10 + 1;
            } while (lVar8 != -8);
            bVar13 = false;
          }
        }
      }
      if (bVar13) goto LAB_00112f1b;
      uVar7 = buf->off - sVar12;
      lVar8 = 0x10;
      do {
        buf->base[sVar12 - 3] = (uint8_t)(uVar7 >> ((byte)lVar8 & 0x3f));
        lVar8 = lVar8 + -8;
        sVar12 = sVar12 + 1;
      } while (lVar8 != -8);
      bVar13 = true;
    }
    else {
LAB_00112f1b:
      bVar13 = false;
    }
    if (bVar13) {
      bVar13 = true;
      if ((ppVar1 != (ptls_key_schedule_t *)0x0) && (ppVar1->num_hashes != 0)) {
        puVar2 = buf->base;
        sVar12 = buf->off;
        pppVar9 = &ppVar1->hashes[0].ctx;
        sVar10 = 0;
        do {
          (*(*pppVar9)->update)(*pppVar9,puVar2 + sVar6,sVar12 - sVar6);
          sVar10 = sVar10 + 1;
          pppVar9 = pppVar9 + 2;
        } while (sVar10 != ppVar1->num_hashes);
        bVar13 = true;
      }
      goto LAB_00112f65;
    }
  }
  bVar13 = false;
LAB_00112f65:
  if (bVar13) {
    iVar5 = (*local_148->commit_message)(local_148);
  }
  return iVar5;
}

Assistant:

static int send_certificate_and_certificate_verify(ptls_t *tls, ptls_message_emitter_t *emitter,
                                                   struct st_ptls_signature_algorithms_t *signature_algorithms,
                                                   ptls_iovec_t context, const char *context_string, int push_status_request,
                                                   const uint16_t *compress_algos, size_t num_compress_algos)
{
    int ret;

    if (signature_algorithms->count == 0) {
        ret = PTLS_ALERT_MISSING_EXTENSION;
        goto Exit;
    }

    { /* send Certificate (or the equivalent) */
        static ptls_emit_certificate_t default_emit_certificate = {default_emit_certificate_cb};
        ptls_emit_certificate_t *emit_certificate =
            tls->ctx->emit_certificate != NULL ? tls->ctx->emit_certificate : &default_emit_certificate;
    Redo:
        if ((ret = emit_certificate->cb(emit_certificate, tls, emitter, tls->key_schedule, context, push_status_request,
                                        compress_algos, num_compress_algos)) != 0) {
            if (ret == PTLS_ERROR_DELEGATE) {
                assert(emit_certificate != &default_emit_certificate);
                emit_certificate = &default_emit_certificate;
                goto Redo;
            }
            goto Exit;
        }
    }

    /* build and send CertificateVerify */
    if (tls->ctx->sign_certificate != NULL) {
        ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY, {
            ptls_buffer_t *sendbuf = emitter->buf;
            size_t algo_off = sendbuf->off;
            ptls_buffer_push16(sendbuf, 0); /* filled in later */
            ptls_buffer_push_block(sendbuf, 2, {
                uint16_t algo;
                uint8_t data[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
                size_t datalen = build_certificate_verify_signdata(data, tls->key_schedule, context_string);
                if ((ret = tls->ctx->sign_certificate->cb(tls->ctx->sign_certificate, tls, &algo, sendbuf,
                                                          ptls_iovec_init(data, datalen), signature_algorithms->list,
                                                          signature_algorithms->count)) != 0) {
                    goto Exit;
                }
                sendbuf->base[algo_off] = (uint8_t)(algo >> 8);
                sendbuf->base[algo_off + 1] = (uint8_t)algo;
            });
        });
    }

Exit:
    return ret;
}